

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error-reporter.c++
# Opt level: O3

SourcePos __thiscall
capnp::compiler::LineBreakTable::toSourcePos(LineBreakTable *this,uint32_t byteOffset)

{
  uint *puVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  SourcePos SVar7;
  bool _kjCondition;
  bool local_11;
  Fault local_10;
  
  puVar1 = (this->lineBreaks).builder.ptr;
  lVar2 = (long)(this->lineBreaks).builder.pos - (long)puVar1;
  if (lVar2 == 0) {
    local_11 = false;
  }
  else {
    local_11 = *puVar1 <= byteOffset;
    if (*puVar1 <= byteOffset) {
      uVar3 = lVar2 >> 2;
      uVar5 = 0;
      if (1 < uVar3) {
        do {
          uVar6 = uVar3 + uVar5 >> 1;
          uVar4 = uVar6;
          if (puVar1[uVar6] <= byteOffset) {
            uVar4 = uVar3;
            uVar5 = uVar6;
          }
          uVar3 = uVar4;
        } while (1 < uVar4 - uVar5);
        uVar5 = uVar5 & 0xffffffff;
      }
      SVar7._0_8_ = (ulong)byteOffset | uVar5 << 0x20;
      SVar7.column = byteOffset - puVar1[uVar5];
      return SVar7;
    }
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
            (&local_10,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/error-reporter.c++"
             ,0x20,FAILED,"vec.size() > 0 && vec[0] <= key","_kjCondition,",&local_11);
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

GlobalErrorReporter::SourcePos LineBreakTable::toSourcePos(uint32_t byteOffset) const {
  uint line = findLargestElementBefore(lineBreaks, byteOffset);
  uint col = byteOffset - lineBreaks[line];
  return GlobalErrorReporter::SourcePos { byteOffset, line, col };
}